

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O3

BlendFunc sglr::rr_util::mapGLBlendFunc(deUint32 func)

{
  if ((int)func < 0x8001) {
    switch(func) {
    case 0x300:
      func = BLENDFUNC_SRC_COLOR;
      break;
    case 0x301:
      return BLENDFUNC_ONE_MINUS_SRC_COLOR;
    case 0x302:
      return BLENDFUNC_SRC_ALPHA;
    case 0x303:
      return BLENDFUNC_ONE_MINUS_SRC_ALPHA;
    case 0x304:
      return BLENDFUNC_DST_ALPHA;
    case 0x305:
      return BLENDFUNC_ONE_MINUS_DST_ALPHA;
    case 0x306:
      return BLENDFUNC_DST_COLOR;
    case 0x307:
      return BLENDFUNC_ONE_MINUS_DST_COLOR;
    case 0x308:
      return BLENDFUNC_SRC_ALPHA_SATURATE;
    default:
      if (1 < func) {
        return BLENDFUNC_LAST;
      }
    }
    return func;
  }
  if ((int)func < 0x8589) {
    switch(func) {
    case 0x8001:
      return BLENDFUNC_CONSTANT_COLOR;
    case 0x8002:
      return BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
    case 0x8003:
      return BLENDFUNC_CONSTANT_ALPHA;
    case 0x8004:
      return BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
    }
  }
  else if ((int)func < 0x88fa) {
    if (func == 0x8589) {
      return BLENDFUNC_SRC1_ALPHA;
    }
    if (func == 0x88f9) {
      return BLENDFUNC_SRC1_COLOR;
    }
  }
  else {
    if (func == 0x88fa) {
      return BLENDFUNC_ONE_MINUS_SRC1_COLOR;
    }
    if (func == 0x88fb) {
      return BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
    }
  }
  return BLENDFUNC_LAST;
}

Assistant:

rr::BlendFunc mapGLBlendFunc (deUint32 func)
{
	switch (func)
	{
		case GL_ZERO:						return rr::BLENDFUNC_ZERO;
		case GL_ONE:						return rr::BLENDFUNC_ONE;
		case GL_SRC_COLOR:					return rr::BLENDFUNC_SRC_COLOR;
		case GL_ONE_MINUS_SRC_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC_COLOR;
		case GL_DST_COLOR:					return rr::BLENDFUNC_DST_COLOR;
		case GL_ONE_MINUS_DST_COLOR:		return rr::BLENDFUNC_ONE_MINUS_DST_COLOR;
		case GL_SRC_ALPHA:					return rr::BLENDFUNC_SRC_ALPHA;
		case GL_ONE_MINUS_SRC_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC_ALPHA;
		case GL_DST_ALPHA:					return rr::BLENDFUNC_DST_ALPHA;
		case GL_ONE_MINUS_DST_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_DST_ALPHA;
		case GL_CONSTANT_COLOR:				return rr::BLENDFUNC_CONSTANT_COLOR;
		case GL_ONE_MINUS_CONSTANT_COLOR:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
		case GL_CONSTANT_ALPHA:				return rr::BLENDFUNC_CONSTANT_ALPHA;
		case GL_ONE_MINUS_CONSTANT_ALPHA:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
		case GL_SRC_ALPHA_SATURATE:			return rr::BLENDFUNC_SRC_ALPHA_SATURATE;
		case GL_SRC1_COLOR:					return rr::BLENDFUNC_SRC1_COLOR;
		case GL_ONE_MINUS_SRC1_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC1_COLOR;
		case GL_SRC1_ALPHA:					return rr::BLENDFUNC_SRC1_ALPHA;
		case GL_ONE_MINUS_SRC1_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
		default:
			DE_ASSERT(false);
			return rr::BLENDFUNC_LAST;
	}
}